

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteGeneric<unsigned_long,unsigned_long,unsigned_long,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftLeftOperator,bool>
               (Vector *left,Vector *right,Vector *result,idx_t count,bool fun)

{
  unsigned_long *result_data_00;
  SelectionVector *lsel;
  UnifiedVectorFormat *in_RCX;
  VectorType in_DL;
  ulong in_RSI;
  ulong in_RDI;
  byte in_R8B;
  unsigned_long *result_data;
  UnifiedVectorFormat rdata;
  UnifiedVectorFormat ldata;
  SelectionVector *rsel;
  undefined1 *count_00;
  unsigned_long *in_stack_ffffffffffffff28;
  unsigned_long *in_stack_ffffffffffffff30;
  UnifiedVectorFormat local_c8 [8];
  ValidityMask *in_stack_ffffffffffffff40;
  ValidityMask *in_stack_ffffffffffffff48;
  element_type *in_stack_ffffffffffffff50;
  UnifiedVectorFormat local_80 [16];
  undefined1 local_70 [63];
  byte local_31;
  undefined8 local_30;
  VectorType local_28;
  ulong local_20;
  ulong local_18;
  
  local_31 = in_R8B & 1;
  local_30 = in_RCX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  local_28 = in_DL;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(local_80);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(local_c8);
  duckdb::Vector::ToUnifiedFormat(local_18,local_30);
  duckdb::Vector::ToUnifiedFormat(local_20,local_30);
  duckdb::Vector::SetVectorType(local_28);
  result_data_00 = FlatVector::GetData<unsigned_long>((Vector *)0xe778ad);
  UnifiedVectorFormat::GetData<unsigned_long>(local_80);
  UnifiedVectorFormat::GetData<unsigned_long>(local_c8);
  count_00 = local_70;
  rsel = (SelectionVector *)&stack0xffffffffffffff48;
  lsel = (SelectionVector *)FlatVector::Validity((Vector *)0xe7792e);
  ExecuteGenericLoop<unsigned_long,unsigned_long,unsigned_long,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftLeftOperator,bool>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,result_data_00,lsel,rsel,
             (idx_t)count_00,in_stack_ffffffffffffff40,in_stack_ffffffffffffff48,
             (ValidityMask *)in_stack_ffffffffffffff50,(bool)local_30._7_1_);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)rsel);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)rsel);
  return;
}

Assistant:

static void ExecuteGeneric(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		UnifiedVectorFormat ldata, rdata;

		left.ToUnifiedFormat(count, ldata);
		right.ToUnifiedFormat(count, rdata);

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		ExecuteGenericLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC>(
		    UnifiedVectorFormat::GetData<LEFT_TYPE>(ldata), UnifiedVectorFormat::GetData<RIGHT_TYPE>(rdata),
		    result_data, ldata.sel, rdata.sel, count, ldata.validity, rdata.validity, FlatVector::Validity(result),
		    fun);
	}